

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O3

column_t __thiscall duckdb::LogicalGet::GetAnyColumn(LogicalGet *this)

{
  const_iterator cVar1;
  column_t *pcVar2;
  
  pcVar2 = &COLUMN_IDENTIFIER_EMPTY;
  cVar1 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->virtual_columns)._M_h,&COLUMN_IDENTIFIER_EMPTY);
  if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>.
      _M_cur == (__node_type *)0x0) {
    pcVar2 = &COLUMN_IDENTIFIER_ROW_ID;
    cVar1 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->virtual_columns)._M_h,&COLUMN_IDENTIFIER_ROW_ID);
    if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>.
        _M_cur == (__node_type *)0x0) {
      return 0;
    }
  }
  return *pcVar2;
}

Assistant:

column_t LogicalGet::GetAnyColumn() const {
	auto entry = virtual_columns.find(COLUMN_IDENTIFIER_EMPTY);
	if (entry != virtual_columns.end()) {
		// return the empty column if the projection supports it
		return COLUMN_IDENTIFIER_EMPTY;
	}
	entry = virtual_columns.find(COLUMN_IDENTIFIER_ROW_ID);
	if (entry != virtual_columns.end()) {
		// return the rowid column if the projection supports it
		return COLUMN_IDENTIFIER_ROW_ID;
	}
	// otherwise return the first column
	return 0;
}